

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O2

ssize_t __thiscall Enterprise::Nick::write(Nick *this,int __fd,void *__buf,size_t __n)

{
  byte source;
  uint16_t uVar1;
  uint uVar2;
  uint *puVar3;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  long lVar4;
  
  source = (byte)__buf;
  puVar3 = &switchD_00305389::switchdataD_00464420;
  switch(__fd & 3) {
  case 0:
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      uVar1 = anon_unknown.dwarf_b5cc96::mapped_colour(source * '\b' + (char)lVar4);
      puVar3 = (uint *)CONCAT62(extraout_var,uVar1);
      this->palette_[lVar4 + 8] = uVar1;
    }
    break;
  case 1:
    if (this->output_type_ == Border) {
      set_output_type(this,Border,true);
    }
    uVar1 = anon_unknown.dwarf_b5cc96::mapped_colour(source);
    puVar3 = (uint *)CONCAT62(extraout_var_00,uVar1);
    this->border_colour_ = uVar1;
    break;
  case 2:
    uVar2 = this->line_parameter_base_ & 0xfffff000;
    puVar3 = (uint *)(ulong)uVar2;
    this->line_parameter_base_ = (ushort)(((uint)__buf & 0xff) << 4) | (ushort)uVar2;
    break;
  case 3:
    uVar2 = this->line_parameter_base_ & 0xff0;
    this->line_parameter_base_ = (ushort)(((uint)__buf & 0xff) << 0xc) | (ushort)uVar2;
    puVar3 = (uint *)(ulong)CONCAT31((int3)(uVar2 >> 8),~this->line_parameter_control_);
    if ((char)(~this->line_parameter_control_ & source) < '\0') {
      this->lines_remaining_ = 0xff;
      this->should_reload_line_parameters_ = true;
    }
    this->line_parameter_control_ = source & 0xc0;
  }
  return (ssize_t)puVar3;
}

Assistant:

void Nick::write(uint16_t address, uint8_t value) {
	switch(address & 3) {
		case 0:
			// Ignored: everything to do with external colour.
			for(int c = 0; c < 8; c++) {
				palette_[c + 8] = mapped_colour(uint8_t(((value & 0x1f) << 3) + c));
			}
		break;
		case 1:
			if(output_type_ == OutputType::Border) {
				set_output_type(OutputType::Border, true);
			}
			border_colour_ = mapped_colour(value);
		break;
		case 2:
			line_parameter_base_ = uint16_t((line_parameter_base_ & 0xf000) | (value << 4));
		break;
		case 3:
			line_parameter_base_ = uint16_t((line_parameter_base_ & 0x0ff0) | (value << 12));

			// Still a mystery to me: the exact meaning of the top two bits here. For now
			// just treat a 0 -> 1 transition of the MSB as a forced frame restart.
			if((value^line_parameter_control_) & value & 0x80) {
				// For now: just force this to be the final line of this mode block.
				// I'm unclear whether I should also reset the horizontal counter
				// (i.e. completely abandon current video phase).
				lines_remaining_ = 0xff;
				should_reload_line_parameters_ = true;
			}
			line_parameter_control_ = value & 0xc0;
		break;
	}
}